

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softhsm2-dump-file.cpp
# Opt level: O2

void dumpMap(va_type *value)

{
  pointer this;
  
  for (this = (value->
              super__Vector_base<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
      this != (value->
              super__Vector_base<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>_>_>
              )._M_impl.super__Vector_impl_data._M_finish; this = this + 1) {
    AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>::dump(this);
  }
  return;
}

Assistant:

void dumpMap(const va_type& value)
{
	for (va_type::const_iterator attr = value.begin(); attr != value.end(); ++attr)
		attr->dump();
}